

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderBuiltinConstantTests.cpp
# Opt level: O2

string * deqp::gles31::Functional::anon_unknown_1::makeCaseName
                   (string *__return_storage_ptr__,string *varName)

{
  char cVar1;
  bool bVar2;
  ostringstream *poVar3;
  size_t ndx;
  ulong uVar4;
  ostringstream name;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
  cVar1 = de::toLower((varName->_M_dataplus)._M_p[3]);
  std::operator<<(&name.super_basic_ostream<char,_std::char_traits<char>_>,cVar1);
  for (uVar4 = 4; uVar4 < varName->_M_string_length; uVar4 = uVar4 + 1) {
    cVar1 = (varName->_M_dataplus)._M_p[uVar4];
    bVar2 = de::isUpper(cVar1);
    poVar3 = &name;
    if (bVar2) {
      poVar3 = (ostringstream *)
               std::operator<<(&name.super_basic_ostream<char,_std::char_traits<char>_>,'_');
      cVar1 = de::toLower(cVar1);
    }
    std::operator<<(&poVar3->super_basic_ostream<char,_std::char_traits<char>_>,cVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
  return __return_storage_ptr__;
}

Assistant:

static std::string makeCaseName (const std::string& varName)
{
	DE_ASSERT(varName.length() > 3);
	DE_ASSERT(varName.substr(0,3) == "gl_");

	std::ostringstream name;
	name << de::toLower(char(varName[3]));

	for (size_t ndx = 4; ndx < varName.length(); ndx++)
	{
		const char c = char(varName[ndx]);
		if (de::isUpper(c))
			name << '_' << de::toLower(c);
		else
			name << c;
	}

	return name.str();
}